

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoofft.c
# Opt level: O1

CURLofft curlx_strtoofft(char *str,char **endp,int base,curl_off_t *num)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  CURLofft CVar4;
  int *piVar5;
  long lVar6;
  char *end;
  char *local_30;
  
  piVar5 = __errno_location();
  *piVar5 = 0;
  *num = 0;
  bVar2 = *str;
  while (bVar2 != 0) {
    iVar3 = Curl_isspace((uint)bVar2);
    if (iVar3 == 0) break;
    pbVar1 = (byte *)(str + 1);
    str = str + 1;
    bVar2 = *pbVar1;
  }
  if (*str == '-') {
    CVar4 = CURL_OFFT_INVAL;
    if (endp != (char **)0x0) {
      *endp = str;
    }
  }
  else {
    lVar6 = strtol(str,&local_30,base);
    if (endp != (char **)0x0) {
      *endp = local_30;
    }
    CVar4 = CURL_OFFT_FLOW;
    if (*piVar5 != 0x22) {
      if (str == local_30) {
        CVar4 = CURL_OFFT_INVAL;
      }
      else {
        *num = lVar6;
        CVar4 = CURL_OFFT_OK;
      }
    }
  }
  return CVar4;
}

Assistant:

CURLofft curlx_strtoofft(const char *str, char **endp, int base,
                         curl_off_t *num)
{
  char *end;
  curl_off_t number;
  errno = 0;
  *num = 0; /* clear by default */

  while(*str && ISSPACE(*str))
    str++;
  if('-' == *str) {
    if(endp)
      *endp = (char *)str; /* didn't actually move */
    return CURL_OFFT_INVAL; /* nothing parsed */
  }
  number = strtooff(str, &end, base);
  if(endp)
    *endp = end;
  if(errno == ERANGE)
    /* overflow/underflow */
    return CURL_OFFT_FLOW;
  else if(str == end)
    /* nothing parsed */
    return CURL_OFFT_INVAL;

  *num = number;
  return CURL_OFFT_OK;
}